

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::UnicodeString::append(UnicodeString *this,UChar32 srcChar)

{
  int32_t srcLength;
  undefined8 in_RAX;
  UnicodeString *pUVar1;
  undefined4 uStack_8;
  UChar buffer [2];
  
  uStack_8 = (undefined4)in_RAX;
  if ((uint)srcChar < 0x10000) {
    buffer[1] = (UChar)((ulong)in_RAX >> 0x30);
    _uStack_8 = CONCAT24((short)srcChar,uStack_8);
    srcLength = 1;
  }
  else {
    if (0x10ffff < (uint)srcChar) {
      return this;
    }
    _uStack_8 = CONCAT24((short)((uint)srcChar >> 10) + -0x2840,uStack_8);
    _uStack_8 = CONCAT26((short)srcChar,_uStack_8) & 0x3ffffffffffffff | 0xdc00000000000000;
    srcLength = 2;
  }
  pUVar1 = doAppend(this,buffer,0,srcLength);
  return pUVar1;
}

Assistant:

UnicodeString&
UnicodeString::append(UChar32 srcChar) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t _length = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, _length, U16_MAX_LENGTH, srcChar, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then _length==0 which turns the doAppend() into a no-op anyway.
  return isError ? *this : doAppend(buffer, 0, _length);
}